

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestPhonySelfReferenceError::Run(GraphTestPhonySelfReferenceError *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *node;
  string err;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,"build a: phony a\n",
              (ManifestParserOptions)0x100000000);
  pTVar1 = g_current_test;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"a",&local_59);
  node = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_38);
  bVar2 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,node,&local_58);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x150,"scan_.RecomputeDirty(GetNode(\"a\"), &err)");
  std::__cxx11::string::~string((string *)&local_38);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("dependency cycle: a -> a [-w phonycycle=err]",&local_58);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x151,"\"dependency cycle: a -> a [-w phonycycle=err]\" == err");
  if (!bVar2) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

TEST_F(GraphTest, PhonySelfReferenceError) {
  ManifestParserOptions parser_opts;
  parser_opts.phony_cycle_action_ = kPhonyCycleActionError;
  AssertParse(&state_,
"build a: phony a\n",
  parser_opts);

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("a"), &err));
  ASSERT_EQ("dependency cycle: a -> a [-w phonycycle=err]", err);
}